

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic-memalign.cpp
# Opt level: O0

void * generic_xxmemalign(size_t alignment,size_t size)

{
  void *pvVar1;
  size_t in_RSI;
  ulong in_RDI;
  void *alignedPtr;
  void *ptr;
  void *local_8;
  
  if ((in_RDI == 0) || ((in_RDI & in_RDI - 1) != 0)) {
    local_8 = (void *)0x0;
  }
  else if (in_RDI < 0x11) {
    local_8 = xxmalloc(in_RSI);
  }
  else {
    local_8 = xxmalloc(in_RSI);
    if ((void *)((ulong)local_8 & (in_RDI - 1 ^ 0xffffffffffffffff)) != local_8) {
      xxfree((void *)0x11985b);
      pvVar1 = xxmalloc(in_RSI);
      local_8 = (void *)((long)pvVar1 + (in_RDI - 1) & (in_RDI - 1 ^ 0xffffffffffffffff));
    }
  }
  return local_8;
}

Assistant:

void * generic_xxmemalign(size_t alignment, size_t size) {
  // Check for non power-of-two alignment.
  if ((alignment == 0) || (alignment & (alignment - 1)))
    {
      return nullptr;
    }

  if (alignment <= alignof(max_align_t)) {
    // Already aligned by default.
    return xxmalloc(size);
  } else {
    // Try to just allocate an object of the requested size.
    // If it happens to be aligned properly, just return it.
    void * ptr = xxmalloc(size);
    if (((size_t) ptr & ~(alignment - 1)) == (size_t) ptr) {
      // It is already aligned just fine; return it.
      return ptr;
    }
    // It was not aligned as requested: free the object and allocate a big one,
    // and align within.
    xxfree(ptr);
    ptr = xxmalloc (size + 2 * alignment);
    void * alignedPtr = (void *) (((size_t) ptr + alignment - 1) & ~(alignment - 1));
    return alignedPtr;
  }
}